

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

void __thiscall chatra::RuntimeImp::addBreakPoint(RuntimeImp *this)

{
  CodePoint *in_RSI;
  
  addBreakPoint((RuntimeImp *)&this[-1].nextBreakPointId,in_RSI);
  return;
}

Assistant:

debugger::BreakPointId RuntimeImp::addBreakPoint(const debugger::CodePoint& point) {
	CHATRA_CHECK_RUNTIME_PAUSED;

	auto it = std::find_if(breakPoints.cbegin(), breakPoints.cend(), [&](decltype(breakPoints)::const_reference e) {
		auto& bp = e.second;
		return bp.point.packageName == point.packageName && bp.point.fileName == point.fileName
				&& bp.point.lineNo == point.lineNo;
	});
	if (it != breakPoints.cend())
		throw IllegalArgumentException();

	BreakPoint bp;
	bp.point = point;
	applyBreakPoint(bp);

	auto breakPointId = static_cast<debugger::BreakPointId>(nextBreakPointId++);
	breakPoints.emplace(breakPointId, std::move(bp));
	return breakPointId;
}